

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall
chrono::ChParticleCloud::IntToDescriptor
          (ChParticleCloud *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double *pdVar1;
  pointer ppCVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ChVectorRef local_48;
  
  ppCVar2 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar2) {
    uVar6 = 0;
    uVar8 = (ulong)off_v;
    do {
      uVar4 = (ulong)(off_v + (int)uVar6 * 6);
      if ((v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -6 <
          (long)uVar4) goto LAB_00532338;
      pdVar1 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      ChVariables::Get_qb(&local_48,(ChVariables *)&ppCVar2[uVar6]->variables);
      if (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_ != 6) goto LAB_00532357;
      uVar3 = 6;
      if ((local_48.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ._0_8_ & 7) == 0) {
        uVar5 = -((uint)((ulong)local_48.
                                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                ._0_8_ >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar5 < 6) {
          uVar3 = (ulong)uVar5;
        }
        if (uVar5 != 0) goto LAB_0053222c;
        uVar3 = 0;
LAB_00532250:
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar3 * 8) = pdVar1[uVar8 + uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 != 6);
      }
      else {
LAB_0053222c:
        uVar7 = 0;
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar7 * 8) = pdVar1[uVar8 + uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
        if ((uint)uVar3 < 6) goto LAB_00532250;
      }
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
          < (long)uVar4) {
LAB_00532338:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      ChVariables::Get_fb(&local_48,
                          (ChVariables *)
                          &(this->particles).
                           super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar6]->variables);
      if (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_ != 6) {
LAB_00532357:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
                     );
      }
      uVar4 = 6;
      if ((local_48.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ._0_8_ & 7) == 0) {
        uVar5 = -((uint)((ulong)local_48.
                                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                ._0_8_ >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar5 < 6) {
          uVar4 = (ulong)uVar5;
        }
        if (uVar5 != 0) goto LAB_005322c7;
        uVar4 = 0;
LAB_005322eb:
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar4 * 8) = pdVar1[uVar8 + uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 6);
      }
      else {
LAB_005322c7:
        uVar3 = 0;
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar3 * 8) = pdVar1[uVar8 + uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
        if ((uint)uVar4 < 6) goto LAB_005322eb;
      }
      ppCVar2 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar8 = (ulong)((int)uVar8 + 6);
    } while (uVar6 < (ulong)((long)(this->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3))
    ;
  }
  return;
}

Assistant:

void ChParticleCloud::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                        const ChStateDelta& v,
                                        const ChVectorDynamic<>& R,
                                        const unsigned int off_L,  // offset in L, Qc
                                        const ChVectorDynamic<>& L,
                                        const ChVectorDynamic<>& Qc) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        particles[j]->variables.Get_qb() = v.segment(off_v + 6 * j, 6);
        particles[j]->variables.Get_fb() = R.segment(off_v + 6 * j, 6);
    }
}